

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# osgen3.c
# Opt level: O0

void osgen_sb_mode_end(void)

{
  osgen_txtwin_t *win_00;
  char **ppcVar1;
  bool bVar2;
  osgen_txtwin_t *win;
  int in_stack_ffffffffffffffe8;
  int in_stack_ffffffffffffffec;
  int in_stack_fffffffffffffff0;
  int in_stack_fffffffffffffff4;
  
  win_00 = S_sbmode_win;
  if (S_sbmode_orig_scrolly < (S_sbmode_win->base).scrolly) {
    osgen_scroll_win_back
              ((osgen_txtwin_t *)CONCAT44(in_stack_fffffffffffffff4,in_stack_fffffffffffffff0),
               in_stack_ffffffffffffffec);
  }
  else if ((S_sbmode_win->base).scrolly < S_sbmode_orig_scrolly) {
    osgen_scroll_win_fwd
              ((osgen_txtwin_t *)CONCAT44(in_stack_fffffffffffffff4,in_stack_fffffffffffffff0),
               CONCAT44(in_stack_ffffffffffffffec,in_stack_ffffffffffffffe8));
  }
  S_gets_y = (S_sbmode_orig_scrolly - (win_00->base).scrolly) + S_gets_y;
  (win_00->base).winy = (win_00->base).winy + -1;
  (win_00->base).ht = (win_00->base).ht + 1;
  (win_00->base).scrolly = (win_00->base).scrolly + -1;
  ossclr(in_stack_fffffffffffffff4,in_stack_fffffffffffffff0,in_stack_ffffffffffffffec,
         in_stack_ffffffffffffffe8,0);
  osgen_scrdisp((osgen_win_t *)CONCAT44(in_stack_fffffffffffffff4,in_stack_fffffffffffffff0),
                in_stack_ffffffffffffffec,in_stack_ffffffffffffffe8,0);
  (win_00->base).x = S_sbmode_orig_x;
  win_00->txtfree = S_sbmode_orig_txtfree;
  while( true ) {
    bVar2 = false;
    if (1 < win_00->line_count) {
      ppcVar1 = osgen_get_line_ptr(win_00,(win_00->base).y);
      bVar2 = ppcVar1 != S_sbmode_orig_last_line;
    }
    if (!bVar2) break;
    win_00->line_count = win_00->line_count - 1;
    (win_00->base).y = (win_00->base).y + -1;
  }
  S_sbmode_win = (osgen_txtwin_t *)0x0;
  return;
}

Assistant:

static void osgen_sb_mode_end()
{
    osgen_txtwin_t *win = S_sbmode_win;
    
    /* restore our original scroll position */
    if (win->base.scrolly > S_sbmode_orig_scrolly)
        osgen_scroll_win_back(win, win->base.scrolly - S_sbmode_orig_scrolly);
    else if (win->base.scrolly < S_sbmode_orig_scrolly)
        osgen_scroll_win_fwd(win, S_sbmode_orig_scrolly - win->base.scrolly);

    /* 
     *   adjust the input editing cursor position if the scrolling position
     *   doesn't match the original position 
     */
    S_gets_y += S_sbmode_orig_scrolly - win->base.scrolly;
    
    /* 
     *   restore our full window area, adding back in the top line that we
     *   removed to make room for the mode line 
     */
    win->base.winy -= 1;
    win->base.ht += 1;
    win->base.scrolly -= 1;
    
    /* redraw the top line, where we drew the mode line */
    ossclr(win->base.winy, win->base.winx,
           win->base.winy, win->base.winx + win->base.wid - 1,
           win->base.oss_fillcolor);
    osgen_scrdisp(&win->base, 0, 0, win->base.wid);

    /* 
     *   Delete the temporary copy of the input from the scrollback buffer.
     *   To do this, restore the x,y position and free pointer, then delete
     *   extra lines from the end of the buffer until the last line points
     *   to the same text it did before we added the command input text.  
     */
    win->base.x = S_sbmode_orig_x;
    win->txtfree = S_sbmode_orig_txtfree;
    while (win->line_count > 1
           && osgen_get_line_ptr(win, win->base.y) != S_sbmode_orig_last_line)
    {
        /* this is an added line - delete the line */
        win->line_count--;
        win->base.y--;
    }

    /* we're no longer in scrollback mode */
    S_sbmode_win = 0;
}